

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_comparison.cpp
# Opt level: O3

void __thiscall
duckdb::ExpressionExecutor::Execute
          (ExpressionExecutor *this,BoundComparisonExpression *expr,ExpressionState *state,
          SelectionVector *sel,idx_t count,Vector *result)

{
  DataChunk *this_00;
  reference result_00;
  reference result_01;
  type pEVar1;
  reference pvVar2;
  InternalException *this_01;
  string local_50;
  
  this_00 = &state->intermediate_chunk;
  DataChunk::Reset(this_00);
  result_00 = vector<duckdb::Vector,_true>::operator[](&this_00->data,0);
  result_01 = vector<duckdb::Vector,_true>::operator[](&this_00->data,1);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->left);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
           ::operator[](&state->child_states,0);
  Execute(this,pEVar1,
          (pvVar2->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,result_00)
  ;
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->right);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
           ::operator[](&state->child_states,1);
  Execute(this,pEVar1,
          (pvVar2->
          super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
          .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,result_01)
  ;
  switch((expr->super_Expression).super_BaseExpression.type) {
  case COMPARE_BOUNDARY_START:
    VectorOperations::Equals(result_00,result_01,result,count);
    return;
  case COMPARE_NOTEQUAL:
    VectorOperations::NotEquals(result_00,result_01,result,count);
    return;
  case COMPARE_LESSTHAN:
    VectorOperations::LessThan(result_00,result_01,result,count);
    return;
  case COMPARE_GREATERTHAN:
    VectorOperations::GreaterThan(result_00,result_01,result,count);
    return;
  case COMPARE_LESSTHANOREQUALTO:
    VectorOperations::LessThanEquals(result_00,result_01,result,count);
    return;
  case COMPARE_GREATERTHANOREQUALTO:
    VectorOperations::GreaterThanEquals(result_00,result_01,result,count);
    return;
  default:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Unknown comparison type!","");
    InternalException::InternalException(this_01,&local_50);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case COMPARE_DISTINCT_FROM:
    VectorOperations::DistinctFrom(result_00,result_01,result,count);
    return;
  case COMPARE_BOUNDARY_END:
    VectorOperations::NotDistinctFrom(result_00,result_01,result,count);
    return;
  }
}

Assistant:

void ExpressionExecutor::Execute(const BoundComparisonExpression &expr, ExpressionState *state,
                                 const SelectionVector *sel, idx_t count, Vector &result) {
	// resolve the children
	state->intermediate_chunk.Reset();
	auto &left = state->intermediate_chunk.data[0];
	auto &right = state->intermediate_chunk.data[1];

	Execute(*expr.left, state->child_states[0].get(), sel, count, left);
	Execute(*expr.right, state->child_states[1].get(), sel, count, right);

	switch (expr.GetExpressionType()) {
	case ExpressionType::COMPARE_EQUAL:
		VectorOperations::Equals(left, right, result, count);
		break;
	case ExpressionType::COMPARE_NOTEQUAL:
		VectorOperations::NotEquals(left, right, result, count);
		break;
	case ExpressionType::COMPARE_LESSTHAN:
		VectorOperations::LessThan(left, right, result, count);
		break;
	case ExpressionType::COMPARE_GREATERTHAN:
		VectorOperations::GreaterThan(left, right, result, count);
		break;
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		VectorOperations::LessThanEquals(left, right, result, count);
		break;
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		VectorOperations::GreaterThanEquals(left, right, result, count);
		break;
	case ExpressionType::COMPARE_DISTINCT_FROM:
		VectorOperations::DistinctFrom(left, right, result, count);
		break;
	case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
		VectorOperations::NotDistinctFrom(left, right, result, count);
		break;
	default:
		throw InternalException("Unknown comparison type!");
	}
}